

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool IsValidSubDVertex(ON_SubDVertex *vertex,unsigned_short level,uint *vertex_id_range,
                      unsigned_short ordinary_valence_count,bool bSilentError)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  ON_SubDEdge *pOVar4;
  ON_SubDFace *pOVar5;
  ON_SubDFace *face;
  uint i_1;
  ON_SubDEdge *edge;
  uint i;
  uint count;
  ON_Internal_DamagedMarker local_38;
  ON_Internal_DamagedMarker dm;
  bool bSilentError_local;
  unsigned_short ordinary_valence_count_local;
  uint *vertex_id_range_local;
  unsigned_short level_local;
  ON_SubDVertex *vertex_local;
  
  dm.m_subd_component._5_1_ = bSilentError;
  dm.m_subd_component._6_2_ = ordinary_valence_count;
  if (vertex == (ON_SubDVertex *)0x0) {
    bVar2 = ON_SubDIsNotValid(bSilentError);
    return bVar2;
  }
  uVar3 = ON_SubDComponentBase::SubdivisionLevel(&vertex->super_ON_SubDComponentBase);
  if (uVar3 != level) {
    bVar2 = ON_SubDIsNotValid((bool)(dm.m_subd_component._5_1_ & 1));
    return bVar2;
  }
  if (vertex_id_range != (uint *)0x0) {
    if ((vertex->super_ON_SubDComponentBase).m_id < *vertex_id_range) {
      bVar2 = ON_SubDIsNotValid((bool)(dm.m_subd_component._5_1_ & 1));
      return bVar2;
    }
    if (vertex_id_range[1] < (vertex->super_ON_SubDComponentBase).m_id) {
      bVar2 = ON_SubDIsNotValid((bool)(dm.m_subd_component._5_1_ & 1));
      return bVar2;
    }
  }
  ON_Internal_DamagedMarker::ON_Internal_DamagedMarker
            (&local_38,&vertex->super_ON_SubDComponentBase);
  if ((vertex->m_edge_count < vertex->m_face_count) &&
     ((vertex->m_vertex_tag != Corner || (vertex->m_edge_count < 3)))) {
    vertex_local._7_1_ = ON_SubDIsNotValid((bool)(dm.m_subd_component._5_1_ & 1));
  }
  else if ((vertex->m_edge_count == 0) || (vertex->m_edges != (ON_SubDEdgePtr *)0x0)) {
    if ((vertex->m_face_count == 0) || (vertex->m_faces != (ON_SubDFace **)0x0)) {
      switch(vertex->m_vertex_tag) {
      case Smooth:
        if (vertex->m_edge_count != vertex->m_face_count) {
          vertex_local._7_1_ = ON_SubDIsNotValid((bool)(dm.m_subd_component._5_1_ & 1));
          goto LAB_00879518;
        }
        break;
      case Crease:
        if (vertex->m_edge_count < 2) {
          vertex_local._7_1_ = ON_SubDIsNotValid((bool)(dm.m_subd_component._5_1_ & 1));
          goto LAB_00879518;
        }
        break;
      case Corner:
        if (vertex->m_edge_count == 0) {
          vertex_local._7_1_ = ON_SubDIsNotValid((bool)(dm.m_subd_component._5_1_ & 1));
          goto LAB_00879518;
        }
        break;
      case Dart:
        if ((level != 0) && (dm.m_subd_component._6_2_ != vertex->m_edge_count)) {
          vertex_local._7_1_ = ON_SubDIsNotValid((bool)(dm.m_subd_component._5_1_ & 1));
          goto LAB_00879518;
        }
        if (vertex->m_edge_count != vertex->m_face_count) {
          vertex_local._7_1_ = ON_SubDIsNotValid((bool)(dm.m_subd_component._5_1_ & 1));
          goto LAB_00879518;
        }
        break;
      default:
        vertex_local._7_1_ = ON_SubDIsNotValid((bool)(dm.m_subd_component._5_1_ & 1));
        goto LAB_00879518;
      }
      uVar1 = vertex->m_edge_count;
      for (edge._0_4_ = 0; (uint)edge < uVar1; edge._0_4_ = (uint)edge + 1) {
        pOVar4 = ON_SubDVertex::Edge(vertex,(uint)edge);
        if (pOVar4 == (ON_SubDEdge *)0x0) {
          vertex_local._7_1_ = ON_SubDIsNotValid((bool)(dm.m_subd_component._5_1_ & 1));
          goto LAB_00879518;
        }
      }
      uVar1 = vertex->m_face_count;
      for (face._4_4_ = 0; face._4_4_ < uVar1; face._4_4_ = face._4_4_ + 1) {
        pOVar5 = ON_SubDVertex::Face(vertex,face._4_4_);
        if (pOVar5 == (ON_SubDFace *)0x0) {
          vertex_local._7_1_ = ON_SubDIsNotValid((bool)(dm.m_subd_component._5_1_ & 1));
          goto LAB_00879518;
        }
      }
      ON_Internal_DamagedMarker::ClearComponent(&local_38);
      vertex_local._7_1_ = true;
    }
    else {
      vertex_local._7_1_ = ON_SubDIsNotValid((bool)(dm.m_subd_component._5_1_ & 1));
    }
  }
  else {
    vertex_local._7_1_ = ON_SubDIsNotValid((bool)(dm.m_subd_component._5_1_ & 1));
  }
LAB_00879518:
  ON_Internal_DamagedMarker::~ON_Internal_DamagedMarker(&local_38);
  return vertex_local._7_1_;
}

Assistant:

static bool IsValidSubDVertex(
  const ON_SubDVertex* vertex,
  unsigned short level,
  unsigned int* vertex_id_range,
  unsigned short ordinary_valence_count,
  bool bSilentError
  )
{
  if (nullptr == vertex)
    return ON_SubDIsNotValid(bSilentError);
  
  if (vertex->SubdivisionLevel() != level)
    return ON_SubDIsNotValid(bSilentError);
  
  if (nullptr != vertex_id_range)
  {
    if (vertex->m_id < vertex_id_range[0])
      return ON_SubDIsNotValid(bSilentError);
    if (vertex->m_id > vertex_id_range[1])
      return ON_SubDIsNotValid(bSilentError);
  }

  ON_Internal_DamagedMarker dm(vertex);

  if (vertex->m_edge_count < vertex->m_face_count)
  {
    if ( ON_SubDVertexTag::Corner != vertex->m_vertex_tag || vertex->m_edge_count < 3 )
      return ON_SubDIsNotValid(bSilentError);
  }

  if (vertex->m_edge_count > 0 && nullptr == vertex->m_edges)
    return ON_SubDIsNotValid(bSilentError);

  if (vertex->m_face_count > 0 && nullptr == vertex->m_faces)
    return ON_SubDIsNotValid(bSilentError);

  switch (vertex->m_vertex_tag)
  {
  case ON_SubDVertexTag::Smooth: // interior vertex
    if (vertex->m_edge_count != vertex->m_face_count)
      return ON_SubDIsNotValid(bSilentError);
    break;

  case ON_SubDVertexTag::Crease:
    if ( vertex->m_edge_count < 2 )
      return ON_SubDIsNotValid(bSilentError);
    break;

  case ON_SubDVertexTag::Corner:
    if ( vertex->m_edge_count < 1 )
      return ON_SubDIsNotValid(bSilentError);
    break;

  case ON_SubDVertexTag::Dart: // interior vertex
    if (level > 0 && ordinary_valence_count != vertex->m_edge_count)
      return ON_SubDIsNotValid(bSilentError);
    if (vertex->m_edge_count != vertex->m_face_count)
      return ON_SubDIsNotValid(bSilentError);
    break;

  default:
    // invalid value for this enum
    return ON_SubDIsNotValid(bSilentError);
    break;
  }

  unsigned int count = vertex->m_edge_count;
  for (unsigned int i = 0; i < count; i++)
  {
    const ON_SubDEdge* edge = vertex->Edge(i);
    if (nullptr == edge)
      return ON_SubDIsNotValid(bSilentError);
  }

  count = vertex->m_face_count;
  for (unsigned int i = 0; i < count; i++)
  {
    const ON_SubDFace* face = vertex->Face(i);
    if (nullptr == face)
      return ON_SubDIsNotValid(bSilentError);
  }

  dm.ClearComponent();
  return true;
}